

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O3

Float __thiscall
pbrt::TrowbridgeReitzDistribution::Lambda(TrowbridgeReitzDistribution *this,Vector3f *w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  float fVar8;
  undefined1 auVar9 [16];
  Float FVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  fVar8 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar8 = fVar8 * fVar8;
  auVar11._0_12_ = ZEXT812(0);
  auVar11._12_4_ = 0;
  auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar8)),auVar11);
  auVar9._0_4_ = auVar12._0_4_ / fVar8;
  auVar9._4_12_ = auVar12._4_12_;
  if (ABS(auVar9._0_4_) != INFINITY) {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar8 = 0.0;
    if ((auVar12._0_4_ != 0.0) || (NAN(auVar12._0_4_))) {
      uVar1 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
      uVar2 = (w->super_Tuple3<pbrt::Vector3,_float>).y;
      auVar13._4_4_ = uVar2;
      auVar13._0_4_ = uVar1;
      auVar13._8_8_ = 0;
      auVar12._4_4_ = auVar12._0_4_;
      auVar12._8_4_ = auVar12._0_4_;
      auVar12._12_4_ = auVar12._0_4_;
      auVar12 = vdivps_avx(auVar13,auVar12);
      auVar6._8_4_ = 0x3f800000;
      auVar6._0_8_ = 0x3f8000003f800000;
      auVar6._12_4_ = 0x3f800000;
      uVar3 = vcmpps_avx512vl(auVar12,auVar6,0xe);
      uVar4 = vcmpss_avx512f(auVar12,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar5 = (bool)((byte)uVar4 & 1);
      auVar11 = vmovshdup_avx(auVar12);
      bVar7 = (byte)(uVar3 >> 1);
      FVar10 = (float)((uint)bVar5 * -0x40800000 +
                      (uint)!bVar5 *
                      ((uint)((byte)uVar3 & 1) * 0x3f800000 +
                      (uint)!(bool)((byte)uVar3 & 1) * auVar12._0_4_)) * this->alpha_x;
      uVar4 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar5 = (bool)((byte)uVar4 & 1);
      fVar8 = (float)((uint)bVar5 * -0x40800000 +
                     (uint)!bVar5 *
                     ((uint)(bVar7 & 1) * 0x3f800000 + (uint)!(bool)(bVar7 & 1) * auVar11._0_4_));
    }
    else {
      FVar10 = this->alpha_x;
    }
    fVar8 = fVar8 * this->alpha_y;
    auVar12 = vfmadd213ss_fma(auVar9,ZEXT416((uint)(FVar10 * FVar10 + fVar8 * fVar8)),
                              ZEXT416(0x3f800000));
    if (auVar12._0_4_ < 0.0) {
      fVar8 = sqrtf(auVar12._0_4_);
    }
    else {
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      fVar8 = auVar12._0_4_;
    }
    auVar11 = ZEXT416((uint)((fVar8 + -1.0) * 0.5));
  }
  return auVar11._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Lambda(const Vector3f &w) const {
        Float tan2Theta = Tan2Theta(w);
        if (IsInf(tan2Theta))
            return 0.;
        // Compute _alpha2_ for direction _w_
        Float alpha2 = Sqr(CosPhi(w) * alpha_x) + Sqr(SinPhi(w) * alpha_y);

        return (-1 + std::sqrt(1 + alpha2 * tan2Theta)) / 2;
    }